

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::BlackbodySpectrum::Sample(BlackbodySpectrum *this,SampledWavelengths *lambda)

{
  array<float,_4> aVar1;
  int i;
  long lVar2;
  Float FVar3;
  SampledSpectrum s;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    FVar3 = Blackbody((lambda->lambda).values[lVar2],this->T);
    *(float *)((long)&local_28 + lVar2 * 4) = FVar3 * this->normalizationFactor;
  }
  aVar1.values[2] = (float)(undefined4)uStack_20;
  aVar1.values[3] = (float)uStack_20._4_4_;
  aVar1.values[0] = (float)(undefined4)local_28;
  aVar1.values[1] = (float)local_28._4_4_;
  return (array<float,_4>)(array<float,_4>)aVar1.values;
}

Assistant:

Sample(const SampledWavelengths &lambda) const {
        SampledSpectrum s;
        for (int i = 0; i < NSpectrumSamples; ++i)
            s[i] = Blackbody(lambda[i], T) * normalizationFactor;
        return s;
    }